

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void mcbsp_set_tagsize(mcbsp_size_t *size)

{
  size_t sVar1;
  size_t sVar2;
  Bsmp *pBVar3;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_set_tagsize: can only be called within SPMD section\n");
  }
  if (size == (mcbsp_size_t *)0x0) {
    bsp_abort("bsp_set_tagsize: NULL ptr as argument is now allowed\n");
  }
  pBVar3 = s_bsmp;
  sVar1 = *size;
  s_bsmp->m_send_empty = false;
  pBVar3->m_set_tag_size_counter = pBVar3->m_set_tag_size_counter + 1;
  sVar2 = pBVar3->m_next_tag_size;
  pBVar3->m_next_tag_size = sVar1;
  *size = sVar2;
  return;
}

Assistant:

void mcbsp_set_tagsize( mcbsp_size_t * size )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_set_tagsize: can only be called within SPMD section\n");

    if (size == NULL)
        bsp_abort("bsp_set_tagsize: NULL ptr as argument is now allowed\n");

    *size = s_bsmp->set_tag_size( *size );
}